

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpectedFunctionsListTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToFirstOne_TestShell::createTest
          (TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToFirstOne_TestShell
           *this)

{
  TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToFirstOne_Test *this_00;
  
  this_00 = (TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToFirstOne_Test *)
            operator_new(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/ExpectedFunctionsListTest.cpp"
                         ,0x98);
  TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToFirstOne_Test::
  TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToFirstOne_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockExpectedCallsList, removeAllExpectationsExceptThisThatRelateToFirstOne)
{
    call1->withName("relate");
    call2->withName("unrelate");
    list->addExpectedCall(call1);
    list->addExpectedCall(call2);
    list->onlyKeepExpectationsRelatedTo("unrelate");
    LONGS_EQUAL(1, list->size());
}